

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateInterfaceProperty
          (cmExportFileGenerator *this,string *propName,string *outputName,cmGeneratorTarget *target
          ,PreprocessContext preprocessRule,ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  char *pcVar1;
  mapped_type *pmVar2;
  allocator local_71;
  string prepro;
  string local_50;
  
  pcVar1 = cmGeneratorTarget::GetProperty(target,propName);
  if (pcVar1 != (char *)0x0) {
    if (*pcVar1 == '\0') {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,outputName);
      std::__cxx11::string::assign((char *)pmVar2);
      return;
    }
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_71);
    cmGeneratorExpression::Preprocess(&prepro,&local_50,preprocessRule,false);
    std::__cxx11::string::~string((string *)&local_50);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpressions(this,&prepro,target,missingTargets,NoReplaceFreeTargets);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,outputName);
      std::__cxx11::string::_M_assign((string *)pmVar2);
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  return;
}

Assistant:

void cmExportFileGenerator::PopulateInterfaceProperty(
  const std::string& propName, const std::string& outputName,
  cmGeneratorTarget* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  const char* input = target->GetProperty(propName);
  if (input) {
    if (!*input) {
      // Set to empty
      properties[outputName] = "";
      return;
    }

    std::string prepro =
      cmGeneratorExpression::Preprocess(input, preprocessRule);
    if (!prepro.empty()) {
      this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                 missingTargets);
      properties[outputName] = prepro;
    }
  }
}